

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

double NULLCTime::clockPrecise(void)

{
  timespec x;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  return (double)local_18.tv_sec * 1000.0 + (double)local_18.tv_nsec / 1000000.0;
}

Assistant:

double clockPrecise()
	{
#if defined(_WIN32)
		LARGE_INTEGER freq, count;
		QueryPerformanceFrequency(&freq);
		QueryPerformanceCounter(&count);
		double temp = double(count.QuadPart) / double(freq.QuadPart);
		return temp * 1000.0;
#elif defined(__linux)
		timespec x;

		clock_gettime(CLOCK_MONOTONIC, &x);

		return x.tv_sec * 1000.0 + x.tv_nsec / 1000000.0;
#else
		return ::clock() * 1000.0 / CLOCKS_PER_SEC;
#endif
	}